

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

void cupdlp_diffTwoNormSquared
               (CUPDLPwork *w,cupdlp_float *x,cupdlp_float *y,cupdlp_int len,cupdlp_float *res)

{
  int in_ECX;
  void *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  cupdlp_float alpha;
  cupdlp_float *in_stack_ffffffffffffffc8;
  cupdlp_float *x_00;
  cupdlp_int n;
  undefined4 in_stack_ffffffffffffffe0;
  
  n = (cupdlp_int)((ulong)in_R8 >> 0x20);
  memcpy(*(void **)(in_RDI + 0x40),in_RSI,(long)in_ECX << 3);
  x_00 = (cupdlp_float *)0xbff0000000000000;
  cupdlp_axpy((CUPDLPwork *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),n,
              (cupdlp_float *)0xbff0000000000000,in_stack_ffffffffffffffc8,(cupdlp_float *)0x7fb627)
  ;
  cupdlp_twoNormSquared
            ((CUPDLPwork *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),n,x_00,
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void cupdlp_diffTwoNormSquared(CUPDLPwork *w, const cupdlp_float *x,
                               const cupdlp_float *y, const cupdlp_int len,
                               cupdlp_float *res) {
  CUPDLP_COPY_VEC(w->buffer2, x, cupdlp_float, len);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(w, len, &alpha, y, w->buffer2);
  cupdlp_twoNormSquared(w, len, w->buffer2, res);
}